

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffpbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  FITSfile *Fptr;
  int *piVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  fitsfile *fptr_00;
  int *in_RCX;
  undefined1 *puVar5;
  long lVar6;
  FITSfile *in_RDX;
  int *in_RSI;
  int *in_RDI;
  char *cptr;
  long nwrite;
  long nspace;
  long bufpos;
  long ntodo;
  long recend;
  long recstart;
  LONGLONG filepos;
  int nbuff;
  int ii;
  int *in_stack_ffffffffffffff78;
  FITSfile *in_stack_ffffffffffffff80;
  int *__n;
  long in_stack_ffffffffffffff88;
  FITSfile *fptr_01;
  undefined8 in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  long local_38;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar7;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (*in_RCX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (int)((ulong)in_RDI >> 0x20),in_RSI,&in_RDX->filehandle);
    }
    if ((long)in_RSI <= 0x7fffffffffffffff) {
      piVar1 = in_RSI;
      if (*(int *)(*(long *)(in_RDI + 2) + 0x50) < 0) {
        ffldrc(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,iVar7,&in_RDX->filehandle);
      }
      if ((long)piVar1 < 0x21c0) {
        fptr_00 = (fitsfile *)
                  (*(long *)(*(long *)(in_RDI + 2) + 0x40) +
                  *(long *)(*(long *)(in_RDI + 2) + 0x568 +
                           (long)*(int *)(*(long *)(in_RDI + 2) + 0x50) * 8) * -0xb40);
        piVar1 = (int *)(0xb40 - (long)fptr_00);
        while (in_RSI != (int *)0x0) {
          __n = piVar1;
          if ((long)in_RSI < (long)piVar1) {
            __n = in_RSI;
          }
          memcpy((void *)((long)&fptr_00->HDUposition +
                         *(long *)(*(long *)(in_RDI + 2) + 0x560) +
                         (long)(*(int *)(*(long *)(in_RDI + 2) + 0x50) * 0xb40)),in_RDX,(size_t)__n)
          ;
          in_RSI = (int *)((long)in_RSI - (long)__n);
          in_RDX = (FITSfile *)((long)__n + (long)in_RDX);
          *(long *)(*(long *)(in_RDI + 2) + 0x40) =
               (long)__n + *(long *)(*(long *)(in_RDI + 2) + 0x40);
          *(undefined4 *)
           (*(long *)(in_RDI + 2) + 0x6a8 + (long)*(int *)(*(long *)(in_RDI + 2) + 0x50) * 4) = 1;
          if (in_RSI != (int *)0x0) {
            ffldrc(fptr_00,(long)piVar1,(int)((ulong)__n >> 0x20),(int *)in_RDX);
            fptr_00 = (fitsfile *)0x0;
            piVar1 = (int *)0xb40;
          }
        }
      }
      else {
        iVar7 = *(int *)(*(long *)(in_RDI + 2) + 0x50);
        local_38 = *(long *)(*(long *)(in_RDI + 2) + 0x40);
        lVar3 = *(long *)(*(long *)(in_RDI + 2) + 0x568 + (long)iVar7 * 8);
        Fptr = (FITSfile *)(((long)piVar1 + local_38 + -1) / 0xb40);
        piVar1 = (int *)(local_38 + lVar3 * -0xb40);
        sVar2 = 0xb40 - (long)piVar1;
        if (sVar2 != 0) {
          memcpy((void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) + (long)(iVar7 * 0xb40) +
                         (long)piVar1),in_RDX,sVar2);
          in_RSI = (int *)((long)in_RSI - sVar2);
          in_RDX = (FITSfile *)((long)&in_RDX->filehandle + sVar2);
          local_38 = sVar2 + local_38;
          *(undefined4 *)(*(long *)(in_RDI + 2) + 0x6a8 + (long)iVar7 * 4) = 1;
        }
        for (local_2c = 0; local_2c < 0x28; local_2c = local_2c + 1) {
          if ((lVar3 <= *(long *)(*(long *)(in_RDI + 2) + 0x568 + (long)local_2c * 8)) &&
             (*(long *)(*(long *)(in_RDI + 2) + 0x568 + (long)local_2c * 8) <= (long)Fptr)) {
            if (*(int *)(*(long *)(in_RDI + 2) + 0x6a8 + (long)local_2c * 4) != 0) {
              ffbfwt(Fptr,(int)((ulong)in_RSI >> 0x20),piVar1);
            }
            *(undefined8 *)(*(long *)(in_RDI + 2) + 0x568 + (long)local_2c * 8) = 0xffffffffffffffff
            ;
          }
        }
        if (*(long *)(*(long *)(in_RDI + 2) + 0x48) != local_38) {
          ffseek(in_stack_ffffffffffffff80,(LONGLONG)in_stack_ffffffffffffff78);
        }
        lVar3 = (((long)in_RSI + -1) / 0xb40) * 0xb40;
        ffwrite(in_RDX,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
               );
        sVar2 = (long)in_RSI - lVar3;
        fptr_01 = (FITSfile *)((long)&in_RDX->filehandle + lVar3);
        *(long *)(*(long *)(in_RDI + 2) + 0x48) = local_38 + lVar3;
        if (*(long *)(*(long *)(in_RDI + 2) + 0x48) < *(long *)(*(long *)(in_RDI + 2) + 0x28)) {
          ffread(fptr_01,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
          *(long *)(*(long *)(in_RDI + 2) + 0x48) = *(long *)(*(long *)(in_RDI + 2) + 0x48) + 0xb40;
        }
        else {
          *(undefined8 *)(*(long *)(in_RDI + 2) + 0x28) =
               *(undefined8 *)(*(long *)(in_RDI + 2) + 0x48);
          if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
            memset((void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) + (long)(iVar7 * 0xb40)),0x20,
                   0xb40);
          }
          else {
            memset((void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) + (long)(iVar7 * 0xb40)),0,
                   0xb40);
          }
        }
        memcpy((void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) + (long)(iVar7 * 0xb40)),fptr_01,
               sVar2);
        *(undefined4 *)(*(long *)(in_RDI + 2) + 0x6a8 + (long)iVar7 * 4) = 1;
        *(FITSfile **)(*(long *)(in_RDI + 2) + 0x568 + (long)iVar7 * 8) = Fptr;
        lVar4 = *(long *)(*(long *)(in_RDI + 2) + 0x30);
        puVar5 = (undefined1 *)((long)&Fptr->filehandle + 1);
        lVar6 = (long)puVar5 * 0xb40;
        if (lVar4 == lVar6 || SBORROW8(lVar4,lVar6) != lVar4 + (long)puVar5 * -0xb40 < 0) {
          lVar4 = (long)((long)&Fptr->filehandle + 1) * 0xb40;
        }
        else {
          lVar4 = *(long *)(*(long *)(in_RDI + 2) + 0x30);
        }
        *(long *)(*(long *)(in_RDI + 2) + 0x30) = lVar4;
        *(size_t *)(*(long *)(in_RDI + 2) + 0x40) = local_38 + lVar3 + sVar2;
      }
      iVar7 = *in_RCX;
    }
    else {
      ffpmsg((char *)0x254ed7);
      *in_RCX = 0x6a;
      iVar7 = *in_RCX;
    }
  }
  else {
    iVar7 = *in_RCX;
  }
  return iVar7;
}

Assistant:

int ffpbyt(fitsfile *fptr,   /* I - FITS file pointer                    */
           LONGLONG nbytes,      /* I - number of bytes to write             */
           void *buffer,     /* I - buffer containing the bytes to write */
           int *status)      /* IO - error status                        */
/*
  put (write) the buffer of bytes to the output FITS file, starting at
  the current file position.  Write large blocks of data directly to disk;
  write smaller segments to intermediate IO buffers to improve efficiency.
*/
{
    int ii, nbuff;
    LONGLONG filepos;
    long recstart, recend;
    long ntodo, bufpos, nspace, nwrite;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nbytes > LONG_MAX) {
        ffpmsg("Number of bytes to write is greater than LONG_MAX (ffpbyt).");
        *status = WRITE_ERROR;
	return(*status);
    }
    
    ntodo =  (long) nbytes;
    cptr = (char *)buffer;

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    if (nbytes >= MINDIRECT)
    {
      /* write large blocks of data directly to disk instead of via buffers */
      /* first, fill up the current IO buffer before flushing it to disk */

      nbuff = (fptr->Fptr)->curbuf;      /* current IO buffer number */
      filepos = (fptr->Fptr)->bytepos;   /* save the write starting position */
      recstart = (fptr->Fptr)->bufrecnum[nbuff];                 /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      /* bufpos is the starting position within the IO buffer */
      bufpos = (long) (filepos - ((LONGLONG)recstart * IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      if (nspace)
      { /* fill up the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN) + bufpos, cptr, nspace);
        ntodo -= nspace;           /* decrement remaining number of bytes */
        cptr += nspace;            /* increment user buffer pointer */
        filepos += nspace;         /* increment file position pointer */
        (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      }

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->bufrecnum[ii] >= recstart
            && (fptr->Fptr)->bufrecnum[ii] <= recend )
        {
          if ((fptr->Fptr)->dirty[ii])        /* flush modified buffer to disk */
             ffbfwt(fptr->Fptr, ii, status);

          (fptr->Fptr)->bufrecnum[ii] = -1;  /* disassociate buffer from the file */
        }
      }

      /* move to the correct write position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      nwrite = ((ntodo - 1) / IOBUFLEN) * IOBUFLEN; /* don't write last buff */

      ffwrite(fptr->Fptr, nwrite, cptr, status); /* write the data */
      ntodo -= nwrite;                /* decrement remaining number of bytes */
      cptr += nwrite;                  /* increment user buffer pointer */
      (fptr->Fptr)->io_pos = filepos + nwrite; /* update the file position */

      if ((fptr->Fptr)->io_pos >= (fptr->Fptr)->filesize) /* at the EOF? */
      {
        (fptr->Fptr)->filesize = (fptr->Fptr)->io_pos; /* increment file size */

        /* initialize the current buffer with the correct fill value */
        if ((fptr->Fptr)->hdutype == ASCII_TBL)
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN);  /* blank fill */
        else
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */
      }
      else
      {
        /* read next record */
        ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
        (fptr->Fptr)->io_pos += IOBUFLEN; 
      }

      /* copy remaining bytes from user buffer into current IO buffer */
      memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), cptr, ntodo);
      (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      (fptr->Fptr)->bufrecnum[nbuff] = recend; /* record number */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
                                       (LONGLONG)(recend + 1) * IOBUFLEN);
      (fptr->Fptr)->bytepos = filepos + nwrite + ntodo;
    }
    else
    {
      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
               IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      while (ntodo)
      {
        nwrite = minvalue(ntodo, nspace);

        /* copy bytes from user's buffer to the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, cptr, nwrite);
        ntodo -= nwrite;            /* decrement remaining number of bytes */
        cptr += nwrite;
        (fptr->Fptr)->bytepos += nwrite;  /* increment file position pointer */
        (fptr->Fptr)->dirty[(fptr->Fptr)->curbuf] = TRUE; /* mark record as modified */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), IGNORE_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }
    return(*status);
}